

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# area_light.h
# Opt level: O0

void __thiscall
CS248::DynamicScene::AreaLight::AreaLight
          (AreaLight *this,LightInfo *light_info,Matrix4x4 *transform)

{
  Vector4D *in_RDX;
  long in_RSI;
  SceneLight *in_RDI;
  Vector3D dim_x;
  Vector3D dim_y;
  Vector4D *this_00;
  Vector4D *v;
  Vector3D *in_stack_fffffffffffffdf8;
  Vector4D local_1f0 [2];
  _func_int **local_198;
  _func_int **local_190;
  _func_int **local_188;
  Vector4D local_180 [2];
  _func_int **local_128;
  Vector4D *in_stack_fffffffffffffee0;
  Matrix4x4 *in_stack_fffffffffffffee8;
  Vector3D local_110;
  Vector3D local_f8;
  Vector4D local_e0 [2];
  _func_int **local_88;
  _func_int **local_80;
  _func_int **local_78;
  Vector4D local_70 [2];
  _func_int **local_30;
  _func_int **local_28;
  _func_int **local_20;
  Vector4D *local_18;
  long local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  SceneLight::SceneLight(in_RDI);
  in_RDI->_vptr_SceneLight = (_func_int **)&PTR_get_static_light_00396388;
  Spectrum::Spectrum((Spectrum *)(in_RDI + 1),0.0,0.0,0.0);
  Vector3D::Vector3D((Vector3D *)(in_RDI + 3));
  Vector3D::Vector3D((Vector3D *)(in_RDI + 6));
  Vector3D::Vector3D((Vector3D *)(in_RDI + 9));
  Vector3D::Vector3D((Vector3D *)(in_RDI + 0xc));
  in_RDI[1]._vptr_SceneLight = *(_func_int ***)(local_10 + 0x4c);
  *(undefined4 *)&in_RDI[2]._vptr_SceneLight = *(undefined4 *)(local_10 + 0x54);
  this_00 = local_18;
  Vector4D::Vector4D(local_70,(Vector3D *)(local_10 + 0x58),1.0);
  Matrix4x4::operator*(in_stack_fffffffffffffee8,in_stack_fffffffffffffee0);
  Vector4D::to3D(this_00);
  in_RDI[3]._vptr_SceneLight = local_30;
  in_RDI[4]._vptr_SceneLight = local_28;
  in_RDI[5]._vptr_SceneLight = local_20;
  v = local_18;
  Vector4D::Vector4D(local_e0,(Vector3D *)(local_10 + 0x70),1.0);
  Matrix4x4::operator*(in_stack_fffffffffffffee8,in_stack_fffffffffffffee0);
  Vector4D::to3D(this_00);
  Vector3D::operator-(in_stack_fffffffffffffdf8,(Vector3D *)v);
  in_RDI[6]._vptr_SceneLight = local_88;
  in_RDI[7]._vptr_SceneLight = local_80;
  in_RDI[8]._vptr_SceneLight = local_78;
  Vector3D::normalize((Vector3D *)v);
  Vector3D::Vector3D(&local_f8,(Vector3D *)(local_10 + 0x88));
  cross(in_stack_fffffffffffffdf8,(Vector3D *)v);
  Vector4D::Vector4D(local_180,&local_110,1.0);
  Matrix4x4::operator*(in_stack_fffffffffffffee8,in_stack_fffffffffffffee0);
  Vector4D::to3D(this_00);
  Vector3D::operator-((Vector3D *)local_18,(Vector3D *)v);
  in_RDI[9]._vptr_SceneLight = local_128;
  in_RDI[10]._vptr_SceneLight = (_func_int **)in_stack_fffffffffffffee0;
  in_RDI[0xb]._vptr_SceneLight = (_func_int **)in_stack_fffffffffffffee8;
  Vector4D::Vector4D(local_1f0,&local_f8,1.0);
  Matrix4x4::operator*(in_stack_fffffffffffffee8,in_stack_fffffffffffffee0);
  Vector4D::to3D(this_00);
  Vector3D::operator-((Vector3D *)local_18,(Vector3D *)v);
  in_RDI[0xc]._vptr_SceneLight = local_198;
  in_RDI[0xd]._vptr_SceneLight = local_190;
  in_RDI[0xe]._vptr_SceneLight = local_188;
  return;
}

Assistant:

AreaLight(const Collada::LightInfo& light_info, const Matrix4x4& transform) {
    this->spectrum = light_info.spectrum;
    this->position = (transform * Vector4D(light_info.position, 1)).to3D();
    this->direction =
        (transform * Vector4D(light_info.direction, 1)).to3D() - position;
    this->direction.normalize();

    Vector3D dim_y = light_info.up;
    Vector3D dim_x = cross(light_info.up, light_info.direction);

    this->dim_x = (transform * Vector4D(dim_x, 1)).to3D() - position;
    this->dim_y = (transform * Vector4D(dim_y, 1)).to3D() - position;
  }